

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Attack(Map *this,Character *from,Direction direction)

{
  int iVar1;
  Character *other;
  World *pWVar2;
  NPC *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar7;
  uint uVar8;
  EIF_Data *pEVar9;
  EIF_Data *pEVar10;
  undefined7 extraout_var;
  mapped_type *pmVar11;
  ENF_Data *pEVar12;
  mapped_type *pmVar13;
  undefined7 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _List_node_base *p_Var16;
  pointer ppNVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar18;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  formula_vars;
  PacketBuilder builder;
  key_type local_1c0;
  uint local_1a0;
  uint local_19c;
  Character *local_198;
  int local_18c;
  double local_188;
  double local_180;
  undefined1 local_178 [32];
  float local_158;
  size_t local_150;
  __node_base_ptr p_Stack_148;
  double local_140;
  int local_138;
  undefined4 local_134;
  key_type local_130;
  string local_110;
  string local_f0;
  key_type local_d0;
  double local_b0;
  pointer local_a8;
  key_type local_a0;
  key_type local_80;
  PacketBuilder local_60;
  undefined4 uVar6;
  
  pEVar9 = EIF::Get(this->world->eif,(from->paperdoll)._M_elems[8]);
  pEVar10 = EIF::Get(this->world->eif,(from->paperdoll)._M_elems[7]);
  if (((pEVar9->subtype != Ranged) || (pEVar10->subtype == Arrows)) ||
     ((pEVar9->id == 0x16d &&
      (iVar5 = std::__cxx11::string::compare((char *)&pEVar9->name), iVar5 == 0)))) {
    from->direction = direction;
    from->attacks = from->attacks + 1;
    Character::CancelSpell(from);
    if (from->arena != (Arena *)0x0) {
      Arena::Attack(from->arena,from,direction);
    }
    if ((pEVar9->field_25).scrollmap == 0) {
      uVar6 = 0;
    }
    else {
      bVar3 = World::IsInstrument(this->world,(pEVar9->field_25).scrollmap);
      uVar6 = (undefined4)CONCAT71(extraout_var,bVar3);
    }
    local_180 = (double)CONCAT44(local_180._4_4_,uVar6);
    if ((char)uVar6 == '\0') {
      if (this->pk == false) {
        pWVar2 = this->world;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"GlobalPK","");
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar2->config,&local_80);
        bVar4 = util::variant::GetBool(pmVar11);
        bVar3 = true;
        if (bVar4) {
          bVar4 = World::PKExcept(this->world,(int)this->id);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = true;
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
      bVar4 = false;
    }
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2)) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar4) || (bVar3 = AttackPK(this,from,DIRECTION_DOWN), !bVar3)) {
      PacketBuilder::PacketBuilder(&local_60,PACKET_ATTACK,PACKET_PLAYER,3);
      iVar5 = Character::PlayerID(from);
      PacketBuilder::AddShort(&local_60,iVar5);
      PacketBuilder::AddChar(&local_60,(uint)direction);
      p_Var16 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      if (p_Var16 != (_List_node_base *)&this->characters) {
        do {
          other = (Character *)p_Var16[1]._M_next;
          if ((other != from) && (bVar3 = Character::InRange(from,other), bVar3)) {
            Character::Send(other,&local_60);
          }
          p_Var16 = p_Var16->_M_next;
        } while (p_Var16 != (_List_node_base *)&this->characters);
      }
      local_198 = from;
      if ((local_180._0_1_ == '\0') && ((from->nointeract & 4) == 0)) {
        local_19c = (uint)from->x;
        local_1a0 = (uint)from->y;
        local_138 = 1;
        if (pEVar9->subtype == Ranged) {
          pWVar2 = this->world;
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"RangedDistance","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar2->config,(key_type *)local_178);
          local_138 = util::variant::GetInt(pmVar11);
          if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
        }
        if (0 < local_138) {
          local_18c = 0;
          do {
            switch(local_198->direction) {
            case DIRECTION_DOWN:
              local_1a0 = local_1a0 + 1;
              break;
            case DIRECTION_LEFT:
              local_19c = local_19c - 1;
              break;
            case DIRECTION_UP:
              local_1a0 = local_1a0 - 1;
              break;
            case DIRECTION_RIGHT:
              local_19c = local_19c + 1;
            }
            ppNVar17 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_a8 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if (ppNVar17 != local_a8) {
              do {
                this_00 = *ppNVar17;
                pEVar12 = NPC::ENF(this_00);
                if ((pEVar12->type == Passive) ||
                   (pEVar12 = NPC::ENF(this_00), pEVar12->type == Aggressive)) {
                  bVar3 = false;
LAB_001743a3:
                  if ((this_00->alive != true) || (local_19c != this_00->x)) goto LAB_0017441e;
                  p_Var16 = (_List_node_base *)
                            CONCAT71((int7)((ulong)p_Var16 >> 8),local_1a0 == this_00->y);
                }
                else {
                  uVar7 = (*(local_198->super_Command_Source)._vptr_Command_Source[1])();
                  p_Var16 = (_List_node_base *)(ulong)uVar7;
                  pWVar2 = this->world;
                  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"killnpc","")
                  ;
                  pmVar11 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&pWVar2->admin_config,&local_130);
                  iVar5 = util::variant::GetInt(pmVar11);
                  bVar3 = true;
                  if (iVar5 <= (int)(uVar7 & 0xff)) goto LAB_001743a3;
LAB_0017441e:
                  p_Var16 = (_List_node_base *)0x0;
                }
                if ((bVar3) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2)) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                if ((char)p_Var16 != '\0') {
                  iVar5 = util::rand();
                  local_140 = (double)CONCAT44(local_140._4_4_,iVar5);
                  local_134 = SUB84(p_Var16,0);
                  util::rand();
                  local_180 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                  uVar8 = (uint)this_00->direction - (uint)local_198->direction;
                  uVar7 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar7 = uVar8;
                  }
                  uVar14 = (undefined7)((ulong)&local_130 >> 8);
                  uVar8 = (uint)CONCAT71(uVar14,1);
                  if ((char)uVar7 == '\x02') {
                    pWVar2 = this->world;
                    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d0,"CriticalRate","");
                    pmVar11 = std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)&pWVar2->config,&local_d0);
                    dVar18 = util::variant::GetFloat(pmVar11);
                    uVar8 = (uint)CONCAT71(uVar14,local_180 < dVar18);
                  }
                  if (((uVar7 & 0xff) == 2) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  pWVar2 = this->world;
                  local_178._0_8_ = local_178 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_178,"CriticalFirstHit","");
                  pmVar11 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&pWVar2->config,(key_type *)local_178);
                  bVar3 = util::variant::GetBool(pmVar11);
                  if (bVar3) {
                    iVar5 = this_00->hp;
                    pEVar12 = NPC::ENF(this_00);
                    iVar1 = pEVar12->hp;
                    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
                      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
                    }
                    uVar8 = uVar8 & 0xff;
                    if (iVar5 == iVar1) {
                      uVar8 = 1;
                    }
                    local_188 = (double)CONCAT44(local_188._4_4_,uVar8);
                  }
                  else {
                    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
                      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
                    }
                    local_188 = (double)CONCAT44(local_188._4_4_,uVar8);
                  }
                  paVar15 = &local_1c0.field_2;
                  local_178._0_8_ = &p_Stack_148;
                  local_178._8_8_ = 1;
                  local_178._16_8_ = 0;
                  local_178._24_8_ = 0;
                  local_158 = 1.0;
                  local_150 = 0;
                  p_Stack_148 = (__node_base_ptr)0x0;
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
                  Character::FormulaVars
                            (local_198,
                             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)local_178,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"target_","")
                  ;
                  NPC::FormulaVars(this_00,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                            *)local_178,&local_110);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p,
                                    local_110.field_2._M_allocated_capacity + 1);
                  }
                  pWVar2 = this->world;
                  local_1c0._M_dataplus._M_p = (pointer)paVar15;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"MobRate","")
                  ;
                  pmVar11 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&pWVar2->config,&local_1c0);
                  local_b0 = util::variant::GetFloat(pmVar11);
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"modifier","")
                  ;
                  uVar7 = local_188._0_4_;
                  pmVar13 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_178,&local_a0);
                  *pmVar13 = local_b0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  local_1c0._M_dataplus._M_p = (pointer)paVar15;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"damage","");
                  pmVar13 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_178,&local_1c0);
                  *pmVar13 = (double)local_140._0_4_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  local_1c0._M_dataplus._M_p = (pointer)paVar15;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1c0,"critical","");
                  pmVar13 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_178,&local_1c0);
                  *pmVar13 = (double)(uVar7 & 0xff);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  pWVar2 = this->world;
                  local_1c0._M_dataplus._M_p = (pointer)paVar15;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"damage","");
                  local_140 = World::EvalFormula(pWVar2,&local_1c0,
                                                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                                  *)local_178);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  pWVar2 = this->world;
                  local_1c0._M_dataplus._M_p = (pointer)paVar15;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1c0,"hit_rate","");
                  dVar18 = World::EvalFormula(pWVar2,&local_1c0,
                                              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                               *)local_178);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != paVar15) {
                    local_188 = dVar18;
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                    dVar18 = local_188;
                  }
                  uVar7 = (int)local_140;
                  if ((int)local_140 < 1) {
                    uVar7 = 0;
                  }
                  if (dVar18 < local_180) {
                    uVar7 = 0;
                  }
                  uVar8 = this_00->hp;
                  if ((int)uVar7 <= this_00->hp) {
                    uVar8 = uVar7;
                  }
                  pWVar2 = this->world;
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1c0,"LimitDamage","");
                  pmVar11 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&pWVar2->config,&local_1c0);
                  bVar3 = util::variant::GetBool(pmVar11);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar3) {
                    uVar7 = uVar8;
                  }
                  p_Var16 = (_List_node_base *)(ulong)uVar7;
                  NPC::Damage(this_00,local_198,uVar7,-1);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_178);
                  if ((char)local_134 != '\0') goto LAB_00174a1c;
                }
                ppNVar17 = ppNVar17 + 1;
              } while (ppNVar17 != local_a8);
            }
            bVar3 = Walkable(this,(uchar)local_19c,(uchar)local_1a0,true);
            local_18c = local_18c + 1;
          } while (bVar3 && local_18c != local_138);
        }
      }
LAB_00174a1c:
      PacketBuilder::~PacketBuilder(&local_60);
    }
  }
  return;
}

Assistant:

void Map::Attack(Character *from, Direction direction)
{
	const EIF_Data& wepdata = this->world->eif->Get(from->paperdoll[Character::Weapon]);
	const EIF_Data& shielddata = this->world->eif->Get(from->paperdoll[Character::Shield]);

	if (wepdata.subtype == EIF::Ranged && shielddata.subtype != EIF::Arrows)
	{
		// Ranged gun hack
		if (wepdata.id != 365 || wepdata.name != "Gun")
		{
			return;
		}
		// / Ranged gun hack
	}

	from->direction = direction;
	from->attacks += 1;

	from->CancelSpell();

	if (from->arena)
	{
		from->arena->Attack(from, direction);
	}

	int wep_graphic = wepdata.dollgraphic;
	bool is_instrument = (wep_graphic != 0 && this->world->IsInstrument(wep_graphic));

	if (!is_instrument && (this->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id))))
	{
		if (this->AttackPK(from, direction))
		{
			return;
		}
	}

	PacketBuilder builder(PACKET_ATTACK, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	if (is_instrument)
		return;

	if (!from->CanInteractCombat())
		return;

	int target_x = from->x;
	int target_y = from->y;

	int range = 1;

	if (wepdata.subtype == EIF::Ranged)
	{
		range = static_cast<int>(this->world->config["RangedDistance"]);
	}

	for (int i = 0; i < range; ++i)
	{
		switch (from->direction)
		{
			case DIRECTION_UP:
				target_y -= 1;
				break;

			case DIRECTION_RIGHT:
				target_x += 1;
				break;

			case DIRECTION_DOWN:
				target_y += 1;
				break;

			case DIRECTION_LEFT:
				target_x -= 1;
				break;
		}

		UTIL_FOREACH(this->npcs, npc)
		{
			if ((npc->ENF().type == ENF::Passive || npc->ENF().type == ENF::Aggressive || from->SourceDutyAccess() >= static_cast<int>(this->world->admin_config["killnpc"]))
			 && npc->alive && npc->x == target_x && npc->y == target_y)
			{
				int amount = util::rand(from->mindam, from->maxdam);
				double rand = util::rand(0.0, 1.0);
				// Checks if target is facing you
				bool critical = std::abs(int(npc->direction) - from->direction) != 2 || rand < static_cast<double>(this->world->config["CriticalRate"]);

				if (this->world->config["CriticalFirstHit"] && npc->hp == npc->ENF().hp)
					critical = true;

				std::unordered_map<std::string, double> formula_vars;

				from->FormulaVars(formula_vars);
				npc->FormulaVars(formula_vars, "target_");
				formula_vars["modifier"] = this->world->config["MobRate"];
				formula_vars["damage"] = amount;
				formula_vars["critical"] = critical;

				amount = this->world->EvalFormula("damage", formula_vars);
				double hit_rate = this->world->EvalFormula("hit_rate", formula_vars);

				if (rand > hit_rate)
				{
					amount = 0;
				}

				amount = std::max(amount, 0);

				int limitamount = std::min(amount, int(npc->hp));

				if (this->world->config["LimitDamage"])
				{
					amount = limitamount;
				}

				npc->Damage(from, amount);
				// *npc may not be valid here

				return;
			}
		}

		if (!this->Walkable(target_x, target_y, true))
		{
			return;
		}
	}
}